

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_char>
          (TryCast *this,string_t input,uint8_t *result,bool strict)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  idx_t pos;
  long lVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  uint uVar9;
  ulong uVar10;
  idx_t iVar11;
  byte bVar12;
  TryCast *pTVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  char cVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  bool bVar24;
  IntegerCastData<short> local_76;
  undefined4 local_74;
  byte *local_70;
  IntegerDecimalCastData<unsigned_char> local_68;
  ulong local_50;
  ulong local_48;
  string_t input_local;
  
  pbVar8 = input.value._8_8_;
  uVar5 = SUB84(result,0);
  pcVar15 = input.value._0_8_;
  if (((ulong)this & 0xffffffff) < 0xd) {
    pcVar15 = input_local.value.pointer.prefix;
  }
  input_local.value.pointer.ptr = input.value._0_8_;
  uVar16 = (ulong)this & 0xffffffff;
  local_74._0_1_ = (byte)result;
  pTVar13 = this;
  if (uVar16 != 0) {
    iVar6 = 3;
    uVar10 = 0;
    do {
      bVar2 = pcVar15[uVar10];
      pTVar13 = (TryCast *)(ulong)(bVar2 - 9);
      if ((4 < bVar2 - 9) && (bVar2 != 0x20)) {
        if (bVar2 == 0x2d) {
          uVar21 = uVar16 - uVar10;
          uVar14 = 1;
          goto LAB_001d78d7;
        }
        if (bVar2 == 0x30 && uVar16 - 1 != uVar10) {
          cVar17 = pcVar15[uVar10 + 1];
          local_70 = (byte *)~uVar10;
          if (cVar17 != 'B') {
            if (cVar17 != 'x') {
              if (cVar17 == 'b') goto LAB_001d7ca7;
              if (cVar17 != 'X') {
                bVar12 = 0;
                bVar24 = false;
                if (((byte)local_74 & (byte)(cVar17 - 0x30U) < 10) == 0) goto LAB_001d7e69;
                goto LAB_001d78f7;
              }
            }
            local_70 = (byte *)((long)local_70 + uVar16);
            bVar12 = 0;
            bVar2 = 0;
            uVar14 = 1;
            goto LAB_001d79a2;
          }
LAB_001d7ca7:
          bVar24 = 1 < (long)local_70 + uVar16;
          if (!bVar24) {
            bVar12 = 0;
            goto LAB_001d78f7;
          }
          uVar14 = 1;
          bVar12 = 0;
          goto LAB_001d7cc6;
        }
LAB_001d7e69:
        bVar12 = 0;
        bVar24 = false;
        if (((byte)local_74 & bVar2 == 0x2b) != 0) goto LAB_001d78f7;
        local_70 = (byte *)(uVar16 - uVar10);
        local_50 = (ulong)(bVar2 == 0x2b);
        bVar12 = 0;
        bVar2 = 0;
        uVar14 = local_50;
        goto LAB_001d7e9b;
      }
      uVar10 = uVar10 + 1;
    } while (uVar16 != uVar10);
  }
  bVar12 = (byte)pTVar13;
  bVar24 = false;
  goto LAB_001d78f7;
  while (lVar4 = uVar10 + uVar14, uVar14 = uVar14 + 1, pcVar15[lVar4] == '0') {
LAB_001d78d7:
    if (uVar21 <= uVar14) {
      uVar14 = 1;
      bVar12 = 0;
      goto LAB_001d7add;
    }
  }
  bVar12 = 0;
LAB_001d78ef:
  bVar24 = false;
  goto LAB_001d78f7;
  while( true ) {
    bVar3 = true;
    uVar23 = uVar14 + 1;
    if ((~uVar14 + uVar16 != uVar10) && (pcVar15[uVar10 + 1 + uVar14] == '_' && (byte)local_74 == 0)
       ) {
      uVar23 = uVar14 + 2;
      if ((uVar16 - uVar14) - 2 == uVar10) {
        bVar3 = false;
      }
      else {
        bVar3 = (byte)(pcVar15[uVar10 + uVar23] - 0x30U) < 10;
      }
    }
    uVar14 = uVar23;
    bVar12 = bVar12 * '\n' - bVar2;
    bVar24 = false;
    if (!bVar3) break;
LAB_001d7add:
    if (uVar21 <= uVar14) goto LAB_001d7d45;
    bVar2 = pcVar15[uVar10 + uVar14] - 0x30;
    if (9 < bVar2) {
      if (pcVar15[uVar10 + uVar14] == '.') {
        if ((byte)local_74 != 0) goto LAB_001d78ef;
        uVar23 = uVar14 + 1;
        if (uVar23 < uVar21) {
          iVar6 = 0;
          if (9 < (byte)(pcVar15[uVar10 + 1 + uVar14] - 0x30U)) goto LAB_001d8487;
          iVar7 = 1;
        }
        else {
          iVar6 = 3;
LAB_001d8487:
          iVar7 = 1;
          if (1 < uVar14) {
            iVar7 = iVar6;
          }
        }
        uVar14 = uVar23;
        if (iVar7 == 3) goto LAB_001d7d45;
        if (iVar7 != 0) goto LAB_001d78ef;
      }
      bVar24 = false;
      if (((ulong)(byte)pcVar15[uVar10 + uVar14] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar14] & 0x3f) & 1) != 0)) {
        uVar23 = uVar14 + 1;
        uVar14 = uVar23;
        if (uVar21 <= uVar23) goto LAB_001d7d45;
        goto LAB_001d7fb8;
      }
      break;
    }
  }
  goto LAB_001d78f7;
  while (uVar23 = uVar23 + 1, uVar14 = uVar21, uVar21 != uVar23) {
LAB_001d7fb8:
    if ((0x20 < (ulong)(byte)pcVar15[uVar10 + uVar23]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar23] & 0x3f) & 1) == 0))
    goto LAB_001d78ef;
  }
LAB_001d7d45:
  bVar24 = 1 < uVar14;
  goto LAB_001d78f7;
LAB_001d79a2:
  do {
    if (local_70 <= uVar14) goto LAB_001d7d45;
    bVar1 = pcVar15[uVar10 + 1 + uVar14];
    bVar22 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar22 = bVar1;
    }
    if (9 < (byte)(bVar22 - 0x30)) {
      bVar24 = false;
      if ((0x25 < bVar22 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar22 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar17 = -0x57;
    if ((char)bVar22 < 'a') {
      cVar17 = -0x30;
    }
    uVar21 = uVar14 + 1;
    if (((uVar16 - uVar14) - 2 == uVar10) || (pcVar15[uVar10 + 2 + uVar14] != '_')) {
LAB_001d7a5e:
      bVar3 = bVar2 <= (byte)~(cVar17 + bVar22) >> 4;
      if (bVar3) {
        bVar2 = cVar17 + bVar22 + bVar2 * '\x10';
        bVar12 = bVar2;
      }
    }
    else {
      uVar21 = uVar14 + 2;
      if ((uVar16 - uVar14) - 3 != uVar10) {
        if (9 < (byte)(pcVar15[uVar10 + 3 + uVar14] - 0x30U)) {
          bVar3 = false;
          uVar9 = (byte)pcVar15[uVar10 + 3 + uVar14] - 0x41;
          if ((0x25 < uVar9) || ((0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0))
          goto LAB_001d7a81;
        }
        goto LAB_001d7a5e;
      }
      bVar3 = false;
    }
LAB_001d7a81:
    bVar24 = false;
    uVar14 = uVar21;
  } while (bVar3);
  goto LAB_001d78f7;
LAB_001d7cc6:
  do {
    bVar2 = 0;
    if (pcVar15[uVar10 + 1 + uVar14] != '0') {
      if (pcVar15[uVar10 + 1 + uVar14] == '1') {
        bVar2 = 1;
        goto LAB_001d7ce2;
      }
LAB_001d80a1:
      bVar24 = false;
      break;
    }
LAB_001d7ce2:
    uVar21 = uVar14 + 1;
    if (((uVar16 - uVar14) - 2 != uVar10) && (pcVar15[uVar10 + 2 + uVar14] == '_')) {
      if (((uVar16 - uVar14) - 3 == uVar10) || ((pcVar15[uVar10 + 3 + uVar14] & 0xfeU) != 0x30))
      goto LAB_001d80a1;
      uVar21 = uVar14 + 2;
    }
    uVar14 = uVar21;
    if ((char)bVar12 < '\0') goto LAB_001d80a1;
    bVar12 = bVar2 | bVar12 * '\x02';
    bVar24 = true;
  } while (uVar14 < (long)local_70 + uVar16);
  goto LAB_001d78f7;
  while( true ) {
    uVar21 = uVar14 + 1;
    if ((byte)(0x2fU - cVar17) / 10 < bVar2) {
      bVar3 = false;
    }
    else {
      bVar2 = (cVar17 - 0x30U) + bVar2 * '\n';
      bVar3 = true;
      bVar12 = bVar2;
      if ((~uVar14 + uVar16 != uVar10) &&
         (pcVar15[uVar10 + 1 + uVar14] == '_' && (byte)local_74 == 0)) {
        uVar21 = uVar14 + 2;
        if ((uVar16 - uVar14) - 2 == uVar10) {
          bVar3 = false;
        }
        else {
          bVar3 = (byte)(pcVar15[uVar10 + uVar21] - 0x30U) < 10;
        }
      }
    }
    bVar24 = false;
    uVar14 = uVar21;
    if (!bVar3) break;
LAB_001d7e9b:
    if (local_70 <= uVar14) goto LAB_001d7f5b;
    cVar17 = pcVar15[uVar10 + uVar14];
    if (9 < (byte)(cVar17 - 0x30U)) {
      if (cVar17 == '.') {
        if ((byte)local_74 != 0) {
          bVar24 = false;
          break;
        }
        uVar21 = uVar14 + 1;
        if ((uVar21 < local_70) && (iVar6 = 0, (byte)(pcVar15[uVar10 + 1 + uVar14] - 0x30U) < 10)) {
          iVar7 = 1;
        }
        else {
          iVar7 = 1;
          if (local_50 < uVar14) {
            iVar7 = iVar6;
          }
        }
        uVar14 = uVar21;
        if (iVar7 == 3) goto LAB_001d7f5b;
        if (iVar7 != 0) goto LAB_001d78ef;
      }
      bVar24 = false;
      if (((ulong)(byte)pcVar15[uVar10 + uVar14] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar14] & 0x3f) & 1) != 0)) {
        uVar21 = uVar14 + 1;
        uVar14 = uVar21;
        if (local_70 <= uVar21) goto LAB_001d7f5b;
        goto LAB_001d81f0;
      }
      break;
    }
  }
  goto LAB_001d78f7;
  while (lVar4 = uVar10 + uVar21, uVar21 = uVar21 + 1, pcVar15[lVar4] == '0') {
LAB_001d7abc:
    if (uVar14 <= uVar21) {
      local_68.result = 0;
      uVar21 = 1;
      goto LAB_001d7d98;
    }
  }
  goto LAB_001d792f;
  while( true ) {
    uVar23 = uVar21 + 1;
    if (local_68.result < (long)((ulong)bVar2 + 0x8000000000000000) / 10) {
      bVar24 = false;
    }
    else {
      local_68.result = local_68.result * 10 - (ulong)bVar2;
      bVar24 = true;
      if ((~uVar21 + uVar16 != uVar10) &&
         (pcVar15[uVar10 + 1 + uVar21] == '_' && (byte)local_74 == 0)) {
        uVar23 = uVar21 + 2;
        if ((uVar16 - uVar21) - 2 == uVar10) {
          bVar24 = false;
        }
        else {
          bVar24 = (byte)(pcVar15[uVar10 + uVar23] - 0x30U) < 10;
        }
      }
    }
    uVar21 = uVar23;
    if (!bVar24) break;
LAB_001d7d98:
    if (uVar14 <= uVar21) goto LAB_001d80b4;
    bVar2 = pcVar15[uVar10 + uVar21] - 0x30;
    if (9 < bVar2) {
      if (pcVar15[uVar10 + uVar21] != '.') goto LAB_001d8419;
      if ((byte)local_74 == 0) {
        uVar23 = uVar21 + 1;
        if (uVar14 <= uVar23) {
          iVar6 = 3;
          uVar18 = uVar23;
          goto LAB_001d862f;
        }
        local_70 = (byte *)0x0;
        uVar19 = uVar23;
        goto LAB_001d8113;
      }
      break;
    }
  }
  goto LAB_001d792d;
  while (uVar19 = uVar18, uVar18 < uVar14) {
LAB_001d8113:
    bVar2 = pcVar15[uVar10 + uVar19] - 0x30;
    local_50 = uVar23;
    if (9 < bVar2) {
      iVar6 = 0;
      goto LAB_001d8617;
    }
    if ((long)local_70 <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_70 = (byte *)((long)local_70 * 10 + (ulong)bVar2);
    }
    uVar18 = uVar19 + 1;
    if (((~uVar19 + uVar16 != uVar10) && (pcVar15[uVar10 + 1 + uVar19] == '_')) &&
       ((uVar18 = uVar19 + 2, (uVar16 - uVar19) - 2 == uVar10 ||
        (9 < (byte)(pcVar15[uVar10 + uVar18] - 0x30U))))) {
      local_68._18_6_ = 0;
      local_68.decimal = (StoreType)local_70;
      iVar7 = 1;
      goto LAB_001d8644;
    }
  }
  iVar6 = 3;
LAB_001d8617:
  local_68._18_6_ = 0;
  local_68.decimal = (StoreType)local_70;
  uVar18 = uVar19;
LAB_001d862f:
  iVar7 = 1;
  if (uVar23 < uVar18) {
    iVar7 = iVar6;
  }
  if (1 < uVar21) {
    iVar7 = iVar6;
  }
LAB_001d8644:
  uVar21 = uVar18;
  if (iVar7 == 3) {
LAB_001d80b4:
    bVar24 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>(&local_68);
    if (bVar24) {
      bVar24 = 1 < uVar21;
      goto LAB_001d792f;
    }
  }
  else if (iVar7 == 0) {
LAB_001d8419:
    bVar2 = pcVar15[uVar10 + uVar21];
    if (bVar2 - 9 < 5) {
LAB_001d842d:
      uVar16 = uVar21 + 1;
      uVar21 = uVar16;
      if (uVar16 < uVar14) {
        do {
          if ((0x20 < (ulong)(byte)pcVar15[uVar10 + uVar16]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar16] & 0x3f) & 1) == 0))
          goto LAB_001d792d;
          uVar16 = uVar16 + 1;
          uVar21 = uVar14;
        } while (uVar14 != uVar16);
      }
      goto LAB_001d80b4;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar21 != 1 && (byte)local_74 == 0) && (uVar21 + 1 < uVar14)) {
        local_76.result = 0;
        pcVar15 = pcVar15 + uVar10 + uVar21 + 1;
        iVar11 = ~uVar10 + (uVar16 - uVar21);
        if (*pcVar15 == '-') {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar11,&local_76,false);
        }
        else {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar11,&local_76,false);
        }
        bVar24 = false;
        if (bVar3 != false) {
          bVar24 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                             (&local_68,local_76.result);
        }
        goto LAB_001d792f;
      }
    }
    else if (bVar2 == 0x20) goto LAB_001d842d;
  }
  goto LAB_001d792d;
  while( true ) {
    uVar21 = uVar19;
    if (0x3fffffffffffffff < local_68.result) goto LAB_001d792d;
    local_68.result = uVar23 + local_68.result * 2;
    if (uVar14 <= uVar21) break;
LAB_001d800c:
    if (pcVar15[uVar10 + 1 + uVar21] == '0') {
      uVar23 = 0;
    }
    else {
      uVar23 = 1;
      if (pcVar15[uVar10 + 1 + uVar21] != '1') goto LAB_001d792d;
    }
    uVar19 = uVar21 + 1;
    if (((uVar16 - uVar21) - 2 != uVar10) && (pcVar15[uVar10 + 2 + uVar21] == '_')) {
      if (((uVar16 - uVar21) - 3 == uVar10) || ((pcVar15[uVar10 + 3 + uVar21] & 0xfeU) != 0x30))
      goto LAB_001d792d;
      uVar19 = uVar21 + 2;
    }
  }
LAB_001d8086:
  bVar24 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_68);
  bVar24 = bVar24 && 1 < uVar14;
  goto LAB_001d792f;
LAB_001d7bbe:
  do {
    if (~uVar10 + uVar16 <= uVar14) {
      bVar24 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_68);
      bVar24 = 1 < uVar14 && bVar24;
      goto LAB_001d792f;
    }
    bVar2 = pcVar15[uVar10 + 1 + uVar14];
    bVar12 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar12 = bVar2;
    }
    if ((9 < (byte)(bVar12 - 0x30)) &&
       ((0x25 < bVar12 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar12 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar17 = -0x57;
    if ((char)bVar12 < 'a') {
      cVar17 = -0x30;
    }
    uVar21 = uVar14 + 1;
    if (((uVar16 - uVar14) - 2 == uVar10) || (pcVar15[uVar10 + 2 + uVar14] != '_')) {
LAB_001d7c71:
      uVar14 = (ulong)((byte)(cVar17 + bVar12) >> 4) ^ 0x7ffffffffffffff;
      lVar4 = local_68.result;
      if (local_68.result <= (long)uVar14) {
        lVar4 = local_68.result * 0x10 + (ulong)(byte)(cVar17 + bVar12);
      }
      bVar24 = local_68.result <= (long)uVar14;
      local_68.result = lVar4;
    }
    else {
      uVar21 = uVar14 + 2;
      if ((uVar16 - uVar14) - 3 != uVar10) {
        if (9 < (byte)(pcVar15[uVar10 + 3 + uVar14] - 0x30U)) {
          uVar9 = (byte)pcVar15[uVar10 + 3 + uVar14] - 0x41;
          bVar24 = false;
          if ((0x25 < uVar9) || (bVar24 = false, (0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) == 0))
          goto LAB_001d7c95;
        }
        goto LAB_001d7c71;
      }
      bVar24 = false;
    }
LAB_001d7c95:
    uVar14 = uVar21;
  } while (bVar24);
  goto LAB_001d792d;
  while( true ) {
    bVar2 = pcVar15[uVar10 + uVar21] - 0x30;
    if (9 < bVar2) {
      if (pcVar15[uVar10 + uVar21] != '.') goto LAB_001d84e4;
      if ((byte)local_74 != 0) goto LAB_001d792d;
      uVar19 = uVar21 + 1;
      if (uVar14 <= uVar19) {
        iVar6 = 3;
        uVar20 = uVar19;
        goto LAB_001d866f;
      }
      local_68.decimal = 0;
      uVar18 = uVar19;
      goto LAB_001d8385;
    }
    uVar19 = uVar21 + 1;
    bVar24 = false;
    if (local_68.result <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.result = local_68.result * 10 + (ulong)bVar2;
      bVar24 = true;
      if ((~uVar21 + uVar16 != uVar10) &&
         (pcVar15[uVar10 + 1 + uVar21] == '_' && (byte)local_74 == 0)) {
        uVar19 = uVar21 + 2;
        if ((uVar16 - uVar21) - 2 == uVar10) {
          bVar24 = false;
        }
        else {
          bVar24 = (byte)(pcVar15[uVar10 + uVar19] - 0x30U) < 10;
        }
      }
    }
    uVar21 = uVar19;
    if (!bVar24) break;
LAB_001d8261:
    local_70 = pbVar8;
    local_50 = uVar23;
    if (uVar14 <= uVar21) goto LAB_001d8329;
  }
  goto LAB_001d8697;
  while (uVar18 = uVar20, uVar20 < uVar14) {
LAB_001d8385:
    bVar2 = pcVar15[uVar10 + uVar18] - 0x30;
    local_48 = uVar19;
    if (9 < bVar2) {
      iVar6 = 0;
      goto LAB_001d865f;
    }
    if (local_68.decimal <= (long)(((ulong)bVar2 ^ 0x7ffffffffffffffe) / 10)) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar2;
    }
    uVar20 = uVar18 + 1;
    if (((~uVar18 + uVar16 != uVar10) && (pcVar15[uVar10 + 1 + uVar18] == '_')) &&
       ((uVar20 = uVar18 + 2, (uVar16 - uVar18) - 2 == uVar10 ||
        (9 < (byte)(pcVar15[uVar10 + uVar20] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar7 = 1;
      goto LAB_001d8686;
    }
  }
  iVar6 = 3;
LAB_001d865f:
  local_68._18_6_ = 0;
  uVar20 = uVar18;
LAB_001d866f:
  iVar7 = 1;
  if (uVar19 < uVar20) {
    iVar7 = iVar6;
  }
  if (uVar23 < uVar21) {
    iVar7 = iVar6;
  }
LAB_001d8686:
  uVar21 = uVar20;
  if (iVar7 == 3) {
LAB_001d8329:
    bVar24 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_68);
    if (bVar24) {
      bVar24 = uVar23 < uVar21;
      pbVar8 = local_70;
      goto LAB_001d792f;
    }
  }
  else if (iVar7 == 0) {
LAB_001d84e4:
    bVar2 = pcVar15[uVar10 + uVar21];
    if (bVar2 - 9 < 5) {
LAB_001d84f4:
      uVar16 = uVar21 + 1;
      uVar21 = uVar16;
      if (uVar16 < uVar14) {
        do {
          if ((0x20 < (ulong)(byte)pcVar15[uVar10 + uVar16]) ||
             ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar16] & 0x3f) & 1) == 0))
          goto LAB_001d8697;
          uVar16 = uVar16 + 1;
          uVar21 = uVar14;
        } while (uVar14 != uVar16);
      }
      goto LAB_001d8329;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar21 != uVar23 && (byte)local_74 == 0) && (uVar21 + 1 < uVar14)) {
        local_76.result = 0;
        pcVar15 = pcVar15 + uVar10 + uVar21 + 1;
        iVar11 = ~uVar10 + (uVar16 - uVar21);
        if (*pcVar15 == '-') {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar11,&local_76,false);
        }
        else {
          bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar15,iVar11,&local_76,false);
        }
        bVar24 = false;
        pbVar8 = local_70;
        if (bVar3 != false) {
          bVar24 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                             (&local_68,local_76.result);
          pbVar8 = local_70;
        }
        goto LAB_001d792f;
      }
    }
    else if (bVar2 == 0x20) goto LAB_001d84f4;
  }
LAB_001d8697:
  bVar24 = false;
  pbVar8 = local_70;
  goto LAB_001d792f;
  while (uVar21 = uVar21 + 1, uVar14 = (ulong)local_70, local_70 != (byte *)uVar21) {
LAB_001d81f0:
    if ((0x20 < (ulong)(byte)pcVar15[uVar10 + uVar21]) ||
       ((0x100003e00U >> ((ulong)(byte)pcVar15[uVar10 + uVar21] & 0x3f) & 1) == 0))
    goto LAB_001d78ef;
  }
LAB_001d7f5b:
  bVar24 = local_50 < uVar14;
LAB_001d78f7:
  if (bVar24) {
    *pbVar8 = bVar12;
    bVar24 = true;
  }
  else {
    if (uVar16 != 0) {
      uVar10 = 0;
      do {
        bVar2 = pcVar15[uVar10];
        if ((0x20 < (ulong)bVar2) || ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
          local_68.result = 0;
          local_68.decimal = 0;
          local_68._16_8_ = 0;
          uVar14 = uVar16 - uVar10;
          local_68.decimal_digits = 0;
          local_74 = uVar5;
          input_local.value._0_8_ = this;
          if (bVar2 == 0x2d) {
            bVar24 = false;
            uVar21 = 1;
            goto LAB_001d7abc;
          }
          if (bVar2 == 0x30 && uVar16 - 1 != uVar10) {
            cVar17 = pcVar15[uVar10 + 1];
            if (cVar17 == 'B') {
LAB_001d7fe4:
              uVar14 = ~uVar10 + uVar16;
              if (uVar14 < 2) goto LAB_001d8086;
              local_68.result = 0;
              uVar21 = 1;
              goto LAB_001d800c;
            }
            if (cVar17 != 'x') {
              if (cVar17 == 'b') goto LAB_001d7fe4;
              if (cVar17 != 'X') {
                if (((byte)local_74 & (byte)(cVar17 - 0x30U) < 10) == 0) goto LAB_001d8233;
                break;
              }
            }
            local_68.result = 0;
            uVar14 = 1;
            goto LAB_001d7bbe;
          }
LAB_001d8233:
          if (((byte)local_74 & bVar2 == 0x2b) == 0) {
            uVar23 = (ulong)(bVar2 == 0x2b);
            local_68.result = 0;
            uVar21 = uVar23;
            goto LAB_001d8261;
          }
          break;
        }
        uVar10 = uVar10 + 1;
      } while (uVar16 != uVar10);
    }
LAB_001d792d:
    bVar24 = false;
LAB_001d792f:
    if (bVar24 != false) {
      *pbVar8 = (byte)local_68.result;
    }
  }
  return bVar24;
}

Assistant:

bool TryCast::Operation(string_t input, uint8_t &result, bool strict) {
	return TrySimpleIntegerCast<uint8_t, false>(input.GetData(), input.GetSize(), result, strict);
}